

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int pack_particle_slice(int left,int width,vector<int,_std::allocator<int>_> *particle_numbers,
                       vector<particle,_std::allocator<particle>_> *particles)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  int in_EDI;
  size_t *unaff_retaddr;
  int k;
  int j;
  int i;
  size_t p_index;
  size_t pn_index;
  undefined4 local_34;
  int iVar2;
  size_t *pn_index_00;
  vector<int,_std::allocator<int>_> *particle_numbers_00;
  
  particle_numbers_00 = (vector<int,_std::allocator<int>_> *)0x0;
  pn_index_00 = (size_t *)0x0;
  for (iVar1 = in_EDI; iVar1 < in_EDI + in_ESI; iVar1 = iVar1 + 1) {
    for (iVar2 = 0; iVar2 < ny_global; iVar2 = iVar2 + 1) {
      for (local_34 = 0; local_34 < nz_global; local_34 = local_34 + 1) {
        pack_cell((int)((ulong)in_RDX >> 0x20),(int)in_RDX,(int)((ulong)in_RCX >> 0x20),
                  particle_numbers_00,pn_index_00,
                  (vector<particle,_std::allocator<particle>_> *)CONCAT44(iVar1,iVar2),unaff_retaddr
                 );
      }
    }
  }
  return (int)pn_index_00;
}

Assistant:

int pack_particle_slice(int left, int width, vector<int> & particle_numbers, vector<particle> & particles) {
    size_t pn_index = 0;
    size_t p_index = 0;

    for (int i=left; i<left+width; i++) {
        for (int j=0;j<ny_global;j++) {
            for (int k=0;k<nz_global;k++) {
                pack_cell(i, j, k, particle_numbers, pn_index, particles, p_index);
            }
        }
    }

    return static_cast<int>(p_index);
}